

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void __thiscall duckdb::Vector::Reference(Vector *this,Value *value)

{
  ulong uVar1;
  bool bVar2;
  LogicalType *this_00;
  pointer this_01;
  size_type sVar3;
  data_ptr_t pdVar4;
  Value *in_RSI;
  undefined1 *in_RDI;
  templated_unique_single_t array_buffer;
  templated_unique_single_t list_buffer;
  templated_unique_single_t vector;
  idx_t i;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *child_vectors;
  child_list_t<LogicalType> *child_types;
  templated_unique_single_t struct_buffer;
  PhysicalType internal_type;
  Value *in_stack_00000180;
  LogicalType *in_stack_fffffffffffffe68;
  Value *in_stack_fffffffffffffe70;
  VectorListBuffer *in_stack_fffffffffffffe78;
  VectorArrayBuffer *ptr;
  Value *in_stack_fffffffffffffe80;
  Value *in_stack_fffffffffffffe88;
  const_reference in_stack_fffffffffffffeb0;
  VectorArrayBuffer local_f0 [2];
  ulong local_58;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *local_38;
  PhysicalType local_21;
  Value *local_10;
  
  *in_RDI = 2;
  local_10 = in_RSI;
  Value::type(in_RSI);
  VectorBuffer::CreateConstantVector((LogicalType *)in_stack_fffffffffffffe78);
  shared_ptr<duckdb::VectorBuffer,_true>::operator=
            ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe80,
             (shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe78);
  shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
            ((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bcaefd);
  this_00 = Value::type(local_10);
  local_21 = LogicalType::InternalType(this_00);
  if (local_21 == STRUCT) {
    make_uniq<duckdb::VectorStructBuffer>();
    Value::type(local_10);
    local_38 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)StructType::GetChildTypes(&in_stack_fffffffffffffe70->type_);
    this_01 = unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
              ::operator->((unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                            *)in_stack_fffffffffffffe70);
    local_50 = VectorStructBuffer::GetChildren(this_01);
    for (local_58 = 0; uVar1 = local_58,
        sVar3 = ::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ::size(local_38), uVar1 < sVar3; local_58 = local_58 + 1) {
      local_f0[0].child.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl._7_1_ = 0;
      bVar2 = Value::IsNull(local_10);
      if (bVar2) {
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                      *)in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
        LogicalType::LogicalType(&in_stack_fffffffffffffe70->type_,in_stack_fffffffffffffe68);
        local_f0[0].child.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl._7_1_ = 1;
        Value::Value(in_stack_fffffffffffffe80,(LogicalType *)in_stack_fffffffffffffe78);
      }
      else {
        StructValue::GetChildren(in_stack_fffffffffffffeb0);
        in_stack_fffffffffffffeb0 =
             vector<duckdb::Value,_true>::operator[]
                       ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffe70,
                        (size_type)in_stack_fffffffffffffe68);
        Value::Value(in_stack_fffffffffffffe80,(Value *)in_stack_fffffffffffffe78);
      }
      make_uniq<duckdb::Vector,_const_duckdb::Value>(in_stack_fffffffffffffe88);
      Value::~Value(in_stack_fffffffffffffe70);
      if ((local_f0[0].child.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>.
           _M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
           super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl._7_1_ & 1) != 0) {
        LogicalType::~LogicalType((LogicalType *)0x2bcb0d5);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ::push_back((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   *)in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)0x2bcb0f9)
      ;
    }
    ::std::unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>_>
    ::release((unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>_>
               *)0x2bcb1b3);
    shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr<duckdb::VectorStructBuffer,_0>
              ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe80,
               (VectorStructBuffer *)in_stack_fffffffffffffe78);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe80,
               (shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe78);
    shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
              ((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bcb1ed);
    bVar2 = Value::IsNull(local_10);
    if (bVar2) {
      SetValue(this,(idx_t)value,in_stack_00000180);
    }
    unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>::
    ~unique_ptr((unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                 *)0x2bcb234);
  }
  else if (local_21 == LIST) {
    Value::type(local_10);
    make_uniq<duckdb::VectorListBuffer,_const_duckdb::LogicalType_&>
              (&in_stack_fffffffffffffe88->type_);
    ::std::unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>::
    release((unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_> *)
            0x2bcb285);
    shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr<duckdb::VectorListBuffer,_0>
              ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe80,
               (shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe78);
    shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
              ((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bcb2bf);
    shared_ptr<duckdb::VectorBuffer,_true>::operator->
              ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe70);
    pdVar4 = VectorBuffer::GetData((VectorBuffer *)0x2bcb2e1);
    *(data_ptr_t *)(in_RDI + 0x20) = pdVar4;
    SetValue(this,(idx_t)value,in_stack_00000180);
    unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>,_true>::
    ~unique_ptr((unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>,_true>
                 *)0x2bcb319);
  }
  else if (local_21 == ARRAY) {
    Value::type(local_10);
    ptr = local_f0;
    make_uniq<duckdb::VectorArrayBuffer,_const_duckdb::LogicalType_&>
              (&in_stack_fffffffffffffe88->type_);
    ::std::unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>_>::
    release((unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>_>
             *)0x2bcb37e);
    shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr<duckdb::VectorArrayBuffer,_0>
              ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe80,ptr);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe80,
               (shared_ptr<duckdb::VectorBuffer,_true> *)ptr);
    shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
              ((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bcb3b8);
    SetValue(this,(idx_t)value,in_stack_00000180);
    unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>,_true>::
    ~unique_ptr((unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>,_true>
                 *)0x2bcb3e0);
  }
  else {
    shared_ptr<duckdb::VectorBuffer,_true>::reset
              ((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bcb416);
    shared_ptr<duckdb::VectorBuffer,_true>::operator->
              ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_fffffffffffffe70);
    pdVar4 = VectorBuffer::GetData((VectorBuffer *)0x2bcb42f);
    *(data_ptr_t *)(in_RDI + 0x20) = pdVar4;
    SetValue(this,(idx_t)value,in_stack_00000180);
  }
  return;
}

Assistant:

void Vector::Reference(const Value &value) {
	D_ASSERT(GetType().id() == value.type().id());
	this->vector_type = VectorType::CONSTANT_VECTOR;
	buffer = VectorBuffer::CreateConstantVector(value.type());
	auto internal_type = value.type().InternalType();
	if (internal_type == PhysicalType::STRUCT) {
		auto struct_buffer = make_uniq<VectorStructBuffer>();
		auto &child_types = StructType::GetChildTypes(value.type());
		auto &child_vectors = struct_buffer->GetChildren();
		for (idx_t i = 0; i < child_types.size(); i++) {
			auto vector =
			    make_uniq<Vector>(value.IsNull() ? Value(child_types[i].second) : StructValue::GetChildren(value)[i]);
			child_vectors.push_back(std::move(vector));
		}
		auxiliary = shared_ptr<VectorBuffer>(struct_buffer.release());
		if (value.IsNull()) {
			SetValue(0, value);
		}
	} else if (internal_type == PhysicalType::LIST) {
		auto list_buffer = make_uniq<VectorListBuffer>(value.type());
		auxiliary = shared_ptr<VectorBuffer>(list_buffer.release());
		data = buffer->GetData();
		SetValue(0, value);
	} else if (internal_type == PhysicalType::ARRAY) {
		auto array_buffer = make_uniq<VectorArrayBuffer>(value.type());
		auxiliary = shared_ptr<VectorBuffer>(array_buffer.release());
		SetValue(0, value);
	} else {
		auxiliary.reset();
		data = buffer->GetData();
		SetValue(0, value);
	}
}